

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointRecord1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::PointRecord1::Encode(PointRecord1 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  PointRecord1 *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  DATA_TYPE::operator<<(pKVar1,&(this->m_Location).super_DataTypeBase);
  return;
}

Assistant:

void PointRecord1::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_Location;
}